

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkle_tree.cpp
# Opt level: O3

tuple<libtorrent::aux::merkle_tree::set_block_result,_int,_int> __thiscall
libtorrent::aux::merkle_tree::set_block(merkle_tree *this,int block_index,sha256_hash *h)

{
  libtorrent *plVar1;
  uint *puVar2;
  pointer pdVar3;
  libtorrent *plVar4;
  libtorrent *this_00;
  _Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_> _Var5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  set_block_result extraout_EDX;
  set_block_result extraout_EDX_00;
  set_block_result extraout_EDX_01;
  set_block_result extraout_EDX_02;
  set_block_result extraout_EDX_03;
  _Head_base<0UL,_libtorrent::aux::merkle_tree::set_block_result,_false> _Var15;
  undefined4 uVar13;
  uint uVar14;
  sha256_hash *in_RCX;
  long lVar16;
  uint uVar17;
  undefined4 in_register_00000034;
  merkle_tree *this_01;
  int level_start;
  uint uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  span<libtorrent::digest32<256L>_> tree;
  span<libtorrent::digest32<256L>_> tree_00;
  span<const_libtorrent::digest32<256L>_> tree_01;
  tuple<libtorrent::aux::merkle_tree::set_block_result,_int,_int> tVar21;
  sha256_hash root;
  undefined1 local_64 [12];
  undefined4 local_58;
  libtorrent lStack_54;
  libtorrent lStack_53;
  libtorrent lStack_52;
  libtorrent lStack_51;
  libtorrent lStack_50;
  libtorrent lStack_4f;
  libtorrent lStack_4e;
  libtorrent lStack_4d;
  libtorrent lStack_4c;
  libtorrent lStack_4b;
  libtorrent lStack_4a;
  libtorrent lStack_49;
  undefined8 local_48;
  undefined8 uStack_40;
  
  this_01 = (merkle_tree *)CONCAT44(in_register_00000034,block_index);
  iVar10 = merkle_num_leafs(this_01->m_num_blocks);
  iVar11 = merkle_first_leaf(iVar10);
  iVar10 = (int)h;
  bVar9 = blocks_verified(this_01,iVar10,1);
  if (bVar9) {
    bVar9 = compare_node(this_01,iVar11 + iVar10,in_RCX);
    *(undefined4 *)&this->m_root = 1;
    *(int *)((long)&this->m_root + 4) = iVar10;
    _Var15._M_head_impl = extraout_EDX;
    if (bVar9) {
      *(undefined4 *)
       &(this->m_tree).
        super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
        super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
        ._M_impl.super__Vector_impl_data._M_start = 0;
    }
    else {
      *(undefined4 *)
       &(this->m_tree).
        super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
        super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
        ._M_impl.super__Vector_impl_data._M_start = 3;
    }
    goto LAB_0022554c;
  }
  allocate_full(this_01);
  lVar16 = (long)(iVar11 + iVar10);
  pdVar3 = (this_01->m_tree).
           super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
           super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar6 = *(undefined8 *)(in_RCX->m_number)._M_elems;
  uVar7 = *(undefined8 *)((in_RCX->m_number)._M_elems + 2);
  uVar8 = *(undefined8 *)((in_RCX->m_number)._M_elems + 6);
  puVar2 = (uint *)((long)pdVar3[lVar16].m_number._M_elems + 0x10);
  *(undefined8 *)puVar2 = *(undefined8 *)((in_RCX->m_number)._M_elems + 4);
  *(undefined8 *)(puVar2 + 2) = uVar8;
  pdVar3 = pdVar3 + lVar16;
  *(undefined8 *)(pdVar3->m_number)._M_elems = uVar6;
  *(undefined8 *)((long)(pdVar3->m_number)._M_elems + 8) = uVar7;
  pdVar3 = (this_01->m_tree).
           super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
           super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  level_start = this_01->m_num_blocks;
  tree_01.m_len = (difference_type)pdVar3;
  tree_01.m_ptr = (digest32<256L> *)local_64;
  merkle_find_known_subtree
            (tree_01,(int)((long)(this_01->m_tree).
                                 super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                 .
                                 super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pdVar3 >> 5),
             iVar10);
  bVar9 = digest32<256L>::is_all_zeros
                    ((this_01->m_tree).
                     super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                     .
                     super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + (int)local_64._0_4_);
  if (bVar9) {
    this->m_root = (char *)CONCAT44(local_64._8_4_,local_64._4_4_);
    *(undefined4 *)
     &(this->m_tree).
      super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
      super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
      _M_impl.super__Vector_impl_data._M_start = 1;
    _Var15._M_head_impl = extraout_EDX_00;
    goto LAB_0022554c;
  }
  plVar4 = (libtorrent *)
           (this_01->m_tree).
           super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
           super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  _local_58 = *(undefined8 *)(plVar4 + (long)(int)local_64._0_4_ * 0x20);
  _lStack_50 = *(undefined8 *)(plVar4 + (long)(int)local_64._0_4_ * 0x20 + 8);
  local_48 = *(undefined8 *)(plVar4 + (long)(int)local_64._0_4_ * 0x20 + 0x10);
  uStack_40 = *(undefined8 *)(plVar4 + (long)(int)local_64._0_4_ * 0x20 + 0x10 + 8);
  tree.m_ptr = (long)(this_01->m_tree).
                     super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                     .
                     super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)plVar4 >> 5;
  tree.m_len._0_4_ = local_64._4_4_;
  tree.m_len._4_4_ = 0;
  merkle_fill_tree(plVar4,tree,local_64._8_4_ + iVar11,level_start);
  this_00 = (libtorrent *)
            (this_01->m_tree).
            super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
            super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  plVar4 = this_00 + (long)(int)local_64._0_4_ * 0x20;
  plVar1 = this_00 + (long)(int)local_64._0_4_ * 0x20 + 0x10;
  auVar20[0] = -(*plVar1 == local_48._0_1_);
  auVar20[1] = -(plVar1[1] == local_48._1_1_);
  auVar20[2] = -(plVar1[2] == local_48._2_1_);
  auVar20[3] = -(plVar1[3] == local_48._3_1_);
  auVar20[4] = -(plVar1[4] == local_48._4_1_);
  auVar20[5] = -(plVar1[5] == local_48._5_1_);
  auVar20[6] = -(plVar1[6] == local_48._6_1_);
  auVar20[7] = -(plVar1[7] == local_48._7_1_);
  auVar20[8] = -(plVar1[8] == uStack_40._0_1_);
  auVar20[9] = -(plVar1[9] == uStack_40._1_1_);
  auVar20[10] = -(plVar1[10] == uStack_40._2_1_);
  auVar20[0xb] = -(plVar1[0xb] == uStack_40._3_1_);
  auVar20[0xc] = -(plVar1[0xc] == uStack_40._4_1_);
  auVar20[0xd] = -(plVar1[0xd] == uStack_40._5_1_);
  auVar20[0xe] = -(plVar1[0xe] == uStack_40._6_1_);
  auVar20[0xf] = -(plVar1[0xf] == uStack_40._7_1_);
  auVar19[0] = -(*plVar4 == local_58._0_1_);
  auVar19[1] = -(plVar4[1] == local_58._1_1_);
  auVar19[2] = -(plVar4[2] == local_58._2_1_);
  auVar19[3] = -(plVar4[3] == local_58._3_1_);
  auVar19[4] = -(plVar4[4] == lStack_54);
  auVar19[5] = -(plVar4[5] == lStack_53);
  auVar19[6] = -(plVar4[6] == lStack_52);
  auVar19[7] = -(plVar4[7] == lStack_51);
  auVar19[8] = -(plVar4[8] == lStack_50);
  auVar19[9] = -(plVar4[9] == lStack_4f);
  auVar19[10] = -(plVar4[10] == lStack_4e);
  auVar19[0xb] = -(plVar4[0xb] == lStack_4d);
  auVar19[0xc] = -(plVar4[0xc] == lStack_4c);
  auVar19[0xd] = -(plVar4[0xd] == lStack_4b);
  auVar19[0xe] = -(plVar4[0xe] == lStack_4a);
  auVar19[0xf] = -(plVar4[0xf] == lStack_49);
  auVar19 = auVar19 & auVar20;
  if ((ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) | (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar19[0xf] >> 7) << 0xf) == 0xffff) {
    uVar14 = this_01->m_num_blocks;
    uVar12 = local_64._4_4_ + local_64._8_4_;
    if ((int)uVar14 <= (int)(local_64._4_4_ + local_64._8_4_)) {
      uVar12 = uVar14;
    }
    if ((int)local_64._8_4_ < (int)uVar12) {
      _Var5.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl =
           (this_01->m_block_verified).m_buf.
           super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
           super__Head_base<0UL,_unsigned_int_*,_false>;
      uVar14 = local_64._8_4_;
      do {
        uVar17 = 0x80000000 >> ((byte)uVar14 & 0x1f);
        uVar18 = uVar14 + 0x1f;
        if (-1 < (int)uVar14) {
          uVar18 = uVar14;
        }
        puVar2 = (uint *)((long)_Var5.super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl + 4
                         + (long)((int)uVar18 >> 5) * 4);
        *puVar2 = *puVar2 | uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 |
                            uVar17 << 0x18;
        uVar14 = uVar14 + 1;
      } while (uVar12 != uVar14);
      uVar14 = this_01->m_num_blocks;
    }
    if (uVar14 - 1 != iVar10) {
      bVar9 = digest32<256L>::is_all_zeros((digest32<256L> *)(this_00 + lVar16 * 0x20 + 0x20));
      uVar13 = 0;
      _Var15._M_head_impl = extraout_EDX_02;
      if (bVar9) goto LAB_00225541;
    }
    optimize_storage(this_01);
    uVar13 = 0;
    _Var15._M_head_impl = extraout_EDX_03;
  }
  else {
    tree_00.m_ptr =
         (long)(this_01->m_tree).
               super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
               .
               super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
               ._M_impl.super__Vector_impl_data._M_finish - (long)this_00 >> 5;
    tree_00.m_len._0_4_ = local_64._4_4_;
    tree_00.m_len._4_4_ = 0;
    merkle_clear_tree(this_00,tree_00,iVar11 + local_64._8_4_,level_start);
    pdVar3 = (this_01->m_tree).
             super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
             super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar2 = (uint *)((long)pdVar3[(int)local_64._0_4_].m_number._M_elems + 0x10);
    *(undefined8 *)puVar2 = local_48;
    *(undefined8 *)(puVar2 + 2) = uStack_40;
    pdVar3 = pdVar3 + (int)local_64._0_4_;
    *(undefined8 *)(pdVar3->m_number)._M_elems = _local_58;
    *(undefined8 *)((long)(pdVar3->m_number)._M_elems + 8) = _lStack_50;
    uVar13 = 2;
    _Var15._M_head_impl = extraout_EDX_01;
  }
LAB_00225541:
  this->m_root = (char *)CONCAT44(local_64._8_4_,local_64._4_4_);
  *(undefined4 *)
   &(this->m_tree).
    super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
    super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>.
    _M_impl.super__Vector_impl_data._M_start = uVar13;
LAB_0022554c:
  tVar21.super__Tuple_impl<0UL,_libtorrent::aux::merkle_tree::set_block_result,_int,_int>.
  super__Head_base<0UL,_libtorrent::aux::merkle_tree::set_block_result,_false>._M_head_impl =
       _Var15._M_head_impl;
  tVar21.super__Tuple_impl<0UL,_libtorrent::aux::merkle_tree::set_block_result,_int,_int>.
  super__Tuple_impl<1UL,_int,_int> = (_Tuple_impl<1UL,_int,_int>)this;
  return (tuple<libtorrent::aux::merkle_tree::set_block_result,_int,_int>)
         tVar21.super__Tuple_impl<0UL,_libtorrent::aux::merkle_tree::set_block_result,_int,_int>;
}

Assistant:

std::tuple<merkle_tree::set_block_result, int, int> merkle_tree::set_block(int const block_index
		, sha256_hash const& h)
	{
#ifdef TORRENT_EXPENSIVE_INVARIANT_CHECKS
		INVARIANT_CHECK;
#endif
		TORRENT_ASSERT(block_index < m_num_blocks);

		auto const num_leafs = merkle_num_leafs(m_num_blocks);
		auto const first_leaf = merkle_first_leaf(num_leafs);
		auto const block_tree_index = first_leaf + block_index;

		if (blocks_verified(block_index, 1))
		{
			// if this blocks's hash is already known, check the passed-in hash against it
			if (compare_node(block_tree_index, h))
				return std::make_tuple(set_block_result::ok, block_index, 1);
			else
				return std::make_tuple(set_block_result::block_hash_failed, block_index, 1);
		}

		allocate_full();

		m_tree[block_tree_index] = h;

		// to avoid wasting a lot of time hashing nodes only to discover they
		// cannot be verified, check first to see if the root of the largest
		// computable subtree is known

		auto const [leafs_start, leafs_size, root_index] =
			merkle_find_known_subtree(m_tree, block_index, m_num_blocks);

		// if the root node is unknown the hashes cannot be verified yet
		if (m_tree[root_index].is_all_zeros())
			return std::make_tuple(set_block_result::unknown, leafs_start, leafs_size);

		// save the root hash because merkle_fill_tree will overwrite it
		sha256_hash const root = m_tree[root_index];
		merkle_fill_tree(m_tree, leafs_size, first_leaf + leafs_start);

		if (root != m_tree[root_index])
		{
			// hash failure, clear all the internal nodes
			// the whole piece failed the hash check. Clear all block hashes
			// in this piece and report a hash failure
			merkle_clear_tree(m_tree, leafs_size, first_leaf + leafs_start);
			m_tree[root_index] = root;
			return std::make_tuple(set_block_result::hash_failed, leafs_start, leafs_size);
		}

		// TODO: this could be done more efficiently if bitfield had a function
		// to set a range of bits
		int const leafs_end = std::min(m_num_blocks, leafs_start + leafs_size);
		for (int i = leafs_start; i < leafs_end; ++i)
			m_block_verified.set_bit(i);

		// attempting to optimize storage is quite costly, only do it if we have
		// a reason to believe it might have an effect
		if (block_index == m_num_blocks - 1 || !m_tree[block_tree_index + 1].is_all_zeros())
			optimize_storage();

		return std::make_tuple(set_block_result::ok, leafs_start, leafs_size);
	}